

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O1

void Acb_NtkPushLogic(Acb_Ntk_t *p,int nLutSize,int fVerbose)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  
  lVar3 = (long)(p->vObjType).nSize;
  if (lVar3 < 1) {
    iVar6 = 0;
  }
  else {
    lVar4 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (uint)('\x06' < (p->vObjType).pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  Acb_NtkCreateFanout(p);
  if (1 < (p->vObjType).nSize) {
    lVar3 = 1;
    do {
      if ((p->vObjType).nSize <= lVar3) goto LAB_00382179;
      uVar7 = (uint)(byte)(p->vObjType).pArray[lVar3];
      if ((4 < uVar7) || ((0x19U >> (uVar7 & 0x1f) & 1) == 0)) {
        if ((p->vObjFans).nSize <= lVar3) goto LAB_003821b7;
        iVar5 = (p->vObjFans).pArray[lVar3];
        if (((long)iVar5 < 0) || ((p->vFanSto).nSize <= iVar5)) goto LAB_00382198;
        if ((p->vFanSto).pArray[iVar5] == 0) {
          Acb_ObjRemoveConst(p,(int)lVar3);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->vObjType).nSize);
  }
  if (1 < (p->vObjType).nSize) {
    lVar3 = 1;
    do {
      if ((p->vObjType).nSize <= lVar3) {
LAB_00382179:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar7 = (uint)(byte)(p->vObjType).pArray[lVar3];
      if ((4 < uVar7) || ((0x19U >> (uVar7 & 0x1f) & 1) == 0)) {
        if ((p->vObjFans).nSize <= lVar3) {
LAB_003821b7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = (p->vObjFans).pArray[lVar3];
        if (((long)iVar5 < 0) || ((p->vFanSto).nSize <= iVar5)) {
LAB_00382198:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if ((p->vFanSto).pArray[iVar5] == 1) {
          Acb_ObjRemoveBufInv(p,(int)lVar3);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->vObjType).nSize);
  }
  uVar7 = 0;
  if (1 < nLutSize) {
    uVar7 = 0;
    iVar5 = 2;
    do {
      if (1 < (p->vObjType).nSize) {
        lVar3 = 1;
        do {
          if ((p->vObjType).nSize <= lVar3) goto LAB_00382179;
          uVar1 = (uint)(byte)(p->vObjType).pArray[lVar3];
          if ((4 < uVar1) || ((0x19U >> (uVar1 & 0x1f) & 1) == 0)) {
            if ((p->vObjFans).nSize <= lVar3) goto LAB_003821b7;
            iVar2 = (p->vObjFans).pArray[lVar3];
            if (((long)iVar2 < 0) || ((p->vFanSto).nSize <= iVar2)) goto LAB_00382198;
            if ((p->vFanSto).pArray[iVar2] == iVar5) {
              uVar7 = uVar7 - 1;
              do {
                iVar2 = Acb_ObjPushToFanins(p,(int)lVar3,nLutSize);
                uVar7 = uVar7 + 1;
              } while (iVar2 != 0);
              if ((p->vObjFans).nSize <= lVar3) goto LAB_003821b7;
              iVar2 = (p->vObjFans).pArray[lVar3];
              if (((long)iVar2 < 0) || ((p->vFanSto).nSize <= iVar2)) goto LAB_00382198;
              if ((p->vFanSto).pArray[iVar2] == 1) {
                Acb_ObjRemoveBufInv(p,(int)lVar3);
              }
            }
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < (p->vObjType).nSize);
      }
      bVar8 = iVar5 != nLutSize;
      iVar5 = iVar5 + 1;
    } while (bVar8);
  }
  lVar3 = (long)(p->vObjType).nSize;
  iVar5 = 0;
  if (0 < lVar3) {
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (uint)('\x06' < (p->vObjType).pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  printf("Saved %d nodes after %d pushes.\n",(ulong)(uint)(iVar6 - iVar5),(ulong)uVar7);
  return;
}

Assistant:

void Acb_NtkPushLogic( Acb_Ntk_t * p, int nLutSize, int fVerbose )
{
    int n = 0, iObj, nNodes = Acb_NtkNodeNum(p), nPushes = 0;
    Acb_NtkCreateFanout( p );  // fanout data structure
    Acb_NtkForEachNodeSupp( p, iObj, 0 )
        Acb_ObjRemoveConst( p, iObj );
    Acb_NtkForEachNodeSupp( p, iObj, 1 )
        Acb_ObjRemoveBufInv( p, iObj );
    for ( n = 2; n <= nLutSize; n++ )
        Acb_NtkForEachNodeSupp( p, iObj, n )
        {
            while ( Acb_ObjPushToFanins(p, iObj, nLutSize) )
                nPushes++;
            if ( Acb_ObjFaninNum(p, iObj) == 1 )
                Acb_ObjRemoveBufInv( p, iObj );
        }
    printf( "Saved %d nodes after %d pushes.\n", nNodes - Acb_NtkNodeNum(p), nPushes );
}